

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O1

void Io_ReadPlaMarkIdentical(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  ulong uVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t __size;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  
  iVar9 = nCubes >> 5;
  if (vMarks->nCap < nCubes) {
    iVar10 = (iVar9 + 1) - (uint)((nCubes & 0x1fU) == 0);
    __size = (long)iVar10 << 2;
    if (vMarks->pArray == (int *)0x0) {
      piVar2 = (int *)malloc(__size);
    }
    else {
      piVar2 = (int *)realloc(vMarks->pArray,__size);
    }
    vMarks->pArray = piVar2;
    if (piVar2 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
    }
    vMarks->nCap = iVar10 * 0x20;
  }
  uVar11 = (uint)((nCubes & 0x1fU) != 0);
  iVar10 = uVar11 + iVar9;
  if (iVar10 != 0 && SCARRY4(uVar11,iVar9) == iVar10 < 0) {
    memset(vMarks->pArray,0,(ulong)(iVar10 - 1) * 4 + 4);
  }
  vMarks->nSize = iVar10 * 0x20;
  if (0 < nCubes) {
    uVar3 = (ulong)(uint)nCubes;
    uVar4 = 1;
    uVar6 = 0;
    do {
      if ((long)vMarks->nSize <= (long)uVar6) {
LAB_00330904:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      piVar2 = vMarks->pArray;
      uVar1 = uVar6 + 1;
      uVar7 = uVar4;
      if (uVar1 < uVar3 && ((uint)piVar2[uVar6 >> 5 & 0x7ffffff] >> ((uint)uVar6 & 0x1f) & 1) == 0)
      {
        do {
          if ((long)vMarks->nSize <= (long)uVar7) goto LAB_00330904;
          uVar8 = uVar7 >> 5 & 0x7ffffff;
          uVar11 = (uint)uVar7 & 0x1f;
          if (((uint)piVar2[uVar8] >> uVar11 & 1) == 0) {
            if (0 < nWords) {
              uVar5 = 0;
              do {
                if (pCs[uVar6][uVar5] != pCs[uVar7][uVar5]) goto LAB_003308de;
                uVar5 = uVar5 + 1;
              } while ((uint)nWords != uVar5);
            }
            piVar2[uVar8] = piVar2[uVar8] | 1 << uVar11;
          }
LAB_003308de:
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar3);
      }
      uVar4 = uVar4 + 1;
      uVar6 = uVar1;
    } while (uVar1 != uVar3);
  }
  return;
}

Assistant:

void Io_ReadPlaMarkIdentical( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c2;
    Vec_BitFill( vMarks, nCubes, 0 );
    for ( c1 = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
            for ( c2 = c1 + 1; c2 < nCubes; c2++ )
                if ( !Vec_BitEntry(vMarks, c2) )
                    if ( Abc_TtEqual(pCs[c1], pCs[c2], nWords) )
                        Vec_BitWriteEntry( vMarks, c2, 1 );
}